

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O0

int __thiscall
tcmalloc::CentralFreeList::FetchFromOneSpans(CentralFreeList *this,int N,void **start,void **end)

{
  Span *span_00;
  undefined8 *puVar1;
  bool bVar2;
  bool local_59;
  undefined8 *local_50;
  void *curr;
  void *prev;
  int result;
  Span *span;
  void **end_local;
  void **start_local;
  int N_local;
  CentralFreeList *this_local;
  
  bVar2 = DLL_IsEmpty(&this->nonempty_);
  if (bVar2) {
    this_local._4_4_ = 0;
  }
  else {
    span_00 = (this->nonempty_).next;
    prev._4_4_ = 0;
    puVar1 = (undefined8 *)(span_00->field_4).objects;
    do {
      local_50 = puVar1;
      puVar1 = (undefined8 *)*local_50;
      prev._4_4_ = prev._4_4_ + 1;
      local_59 = prev._4_4_ < N && puVar1 != (undefined8 *)0x0;
    } while (local_59);
    if (puVar1 == (undefined8 *)0x0) {
      DLL_Remove(span_00);
      DLL_Prepend(&this->empty_,span_00);
    }
    *start = (void *)span_00->field_4;
    *end = local_50;
    (span_00->field_4).objects = puVar1;
    SLL_SetNext(*end,(void *)0x0);
    *(uint *)&span_00->field_0x28 =
         *(uint *)&span_00->field_0x28 & 0xffff0000 |
         (*(uint *)&span_00->field_0x28 & 0xffff) + prev._4_4_ & 0xffff;
    this->counter_ = this->counter_ - (long)prev._4_4_;
    this_local._4_4_ = prev._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int CentralFreeList::FetchFromOneSpans(int N, void **start, void **end) {
  if (tcmalloc::DLL_IsEmpty(&nonempty_)) return 0;
  Span* span = nonempty_.next;

  ASSERT(span->objects != nullptr);

  int result = 0;
  void *prev, *curr;
  curr = span->objects;
  do {
    prev = curr;
    curr = *(reinterpret_cast<void**>(curr));
  } while (++result < N && curr != nullptr);

  if (curr == nullptr) {
    // Move to empty list
    tcmalloc::DLL_Remove(span);
    tcmalloc::DLL_Prepend(&empty_, span);
  }

  *start = span->objects;
  *end = prev;
  span->objects = curr;
  SLL_SetNext(*end, nullptr);
  span->refcount += result;
  counter_ -= result;
  return result;
}